

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,BlockVariable *var)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  Latin1Content LVar4;
  long in_RDX;
  char *pcVar5;
  undefined8 *puVar6;
  QArrayData *this;
  QTextStream *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QDebugStateSaver saver;
  QDebug local_78;
  QtPrivate local_70 [8];
  QDebug local_68;
  QtPrivate local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)var);
  pQVar7 = (QTextStream *)(var->name).d.d;
  pQVar7[0x30] = (QTextStream)0x0;
  QVar8.m_data = (storage_type *)0xe;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar7,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
  }
  LVar4 = ContainsBinary;
  lVar3 = 0;
  do {
    if (*(int *)(typeTab[0].k + lVar3 + 0x14) == *(int *)(in_RDX + 0x18)) {
      pcVar5 = typeTab[0].k + lVar3;
      LVar4 = ~ContainsBinary;
      pcVar2 = pcVar5;
      do {
        LVar4 = LVar4 + ContainsLatin1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
      goto LAB_0046a8f8;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x678);
  pcVar5 = (char *)0x0;
LAB_0046a8f8:
  QDebug::putByteArray((char *)var,(ulong)pcVar5,LVar4);
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  QTextStream::operator<<(pQVar7,' ');
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
  }
  puVar6 = *(undefined8 **)(in_RDX + 8);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)var,(ulong)puVar6,(Latin1Content)*(undefined8 *)(in_RDX + 0x10));
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  if (*(int *)(in_RDX + 0x1c) != -1) {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar9.m_data = &DAT_00000008;
    QVar9.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
    QTextStream::operator<<(pQVar7,*(int *)(in_RDX + 0x1c));
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
  }
  pQVar7[0x30] = (QTextStream)0x0;
  QVar10.m_data = &DAT_00000006;
  QVar10.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar7,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  QTextStream::operator<<(pQVar7,*(int *)(in_RDX + 0x20));
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  if (*(long *)(in_RDX + 0x38) != 0) {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar11.m_data = (storage_type *)0x7;
    QVar11.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    local_50[0] = &((var->name).d.d)->super_QArrayData;
    if ((char)local_50[0][3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_50[0],' ');
      local_50[0] = &((var->name).d.d)->super_QArrayData;
    }
    *(int *)&local_50[0][2].alloc = (int)local_50[0][2].alloc + 1;
    local_68.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<int>>
              (local_60,(Stream *)local_50,"QList",(QList<int> *)(in_RDX + 0x28));
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  if (*(int *)(in_RDX + 0x40) != 0) {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar12.m_data = (storage_type *)0xd;
    QVar12.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
    QTextStream::operator<<(pQVar7,*(int *)(in_RDX + 0x40));
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
  }
  if (*(int *)(in_RDX + 0x44) != 0) {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar13.m_data = (storage_type *)0xe;
    QVar13.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
    QTextStream::operator<<(pQVar7,*(int *)(in_RDX + 0x44));
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
  }
  if (*(char *)(in_RDX + 0x48) == '\x01') {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar14.m_data = (storage_type *)0x9;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar7 = (QTextStream *)(var->name).d.d;
    if (pQVar7[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar7,' ');
      pQVar7 = (QTextStream *)(var->name).d.d;
    }
  }
  if (*(long *)(in_RDX + 0x60) != 0) {
    pQVar7[0x30] = (QTextStream)0x0;
    QVar15.m_data = (storage_type *)0xf;
    QVar15.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(pQVar7,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    this = &((var->name).d.d)->super_QArrayData;
    if ((char)this[3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)this,' ');
      this = &((var->name).d.d)->super_QArrayData;
    }
    *(int *)&this[2].alloc = (int)this[2].alloc + 1;
    local_78.stream = (Stream *)0x0;
    local_50[0] = this;
    QtPrivate::printSequentialContainer<QList<QShaderDescription::BlockVariable>>
              (local_70,(Stream *)local_50,"QList",
               (QList<QShaderDescription::BlockVariable> *)(in_RDX + 0x50));
    QDebug::~QDebug((QDebug *)local_50);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug(&local_78);
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  pQVar7[0x30] = (QTextStream)0x0;
  QTextStream::operator<<(pQVar7,')');
  pQVar7 = (QTextStream *)(var->name).d.d;
  if (pQVar7[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar7,' ');
    pQVar7 = (QTextStream *)(var->name).d.d;
  }
  (var->name).d.d = (Data *)0x0;
  *(QTextStream **)dbg.stream = pQVar7;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::BlockVariable &var)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "BlockVariable(" << typeStr(var.type) << ' ' << var.name;
    if (var.offset != -1)
        dbg.nospace() << " offset=" << var.offset;
    dbg.nospace() << " size=" << var.size;
    if (!var.arrayDims.isEmpty())
        dbg.nospace() << " array=" << var.arrayDims;
    if (var.arrayStride)
        dbg.nospace() << " arrayStride=" << var.arrayStride;
    if (var.matrixStride)
        dbg.nospace() << " matrixStride=" << var.matrixStride;
    if (var.matrixIsRowMajor)
        dbg.nospace() << " [rowmaj]";
    if (!var.structMembers.isEmpty())
        dbg.nospace() << " structMembers=" << var.structMembers;
    dbg.nospace() << ')';
    return dbg;
}